

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filehandle.cc
# Opt level: O1

RC __thiscall
RM_FileHandle::GetNextOneBit(RM_FileHandle *this,char *bitmap,int size,int start,int *location)

{
  int i;
  int iVar1;
  
  if (start < size) {
    do {
      iVar1 = start + 7;
      if (-1 < start) {
        iVar1 = start;
      }
      if (((uint)(int)bitmap[iVar1 >> 3] >> (start % 8 & 0x1fU) & 1) != 0) {
        *location = start;
        return 0;
      }
      start = start + 1;
    } while (size != start);
  }
  return 0x6d;
}

Assistant:

RC RM_FileHandle::GetNextOneBit(char *bitmap, int size, int start, int &location){
  for(int i = start; i < size; i++){
    int chunk = i /8;
    int offset = i - chunk*8;
    if (((bitmap[chunk] & (1 << offset)) != 0)){
      location = i;
      return (0);
    }
  }
  return RM_ENDOFPAGE;
}